

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall YAML::Parser::HandleDirective(Parser *this,Token *token)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)&token->value);
  if (iVar1 == 0) {
    HandleYamlDirective(this,token);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)&token->value);
  if (iVar1 != 0) {
    return;
  }
  HandleTagDirective(this,token);
  return;
}

Assistant:

void Parser::HandleDirective(const Token& token) {
  if (token.value == "YAML") {
    HandleYamlDirective(token);
  } else if (token.value == "TAG") {
    HandleTagDirective(token);
  }
}